

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::clauseChemObjName(SelectionCompiler *this)

{
  bool bVar1;
  undefined1 uVar2;
  SelectionCompiler *in_RDI;
  string name;
  Token token;
  undefined4 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4d;
  undefined1 in_stack_ffffffffffffff4e;
  any *in_stack_ffffffffffffff58;
  type_info *in_stack_ffffffffffffff60;
  SelectionCompiler *in_stack_ffffffffffffff68;
  SelectionCompiler *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string local_48 [32];
  int local_28;
  byte local_1;
  
  tokenNext(in_stack_ffffffffffffff68);
  if (local_28 == 1) {
    std::any::type(in_stack_ffffffffffffff58);
    bVar1 = std::type_info::operator==
                      (in_stack_ffffffffffffff60,(type_info *)in_stack_ffffffffffffff58);
    if (bVar1) {
      std::any_cast<std::__cxx11::string>(in_stack_ffffffffffffff58);
      uVar2 = isNameValid(in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->filename);
      if ((bool)uVar2) {
        std::any::
        any<std::__cxx11::string&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                  ((any *)in_RDI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff4e,
                                           CONCAT15(in_stack_ffffffffffffff4d,
                                                    CONCAT14(in_stack_ffffffffffffff4c,
                                                             in_stack_ffffffffffffff48)))));
        Token::Token((Token *)in_RDI,
                     CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffff4e,
                                             CONCAT11(in_stack_ffffffffffffff4d,
                                                      in_stack_ffffffffffffff4c))),(any *)0x3faabb);
        local_1 = addTokenToPostfix(in_RDI,(Token *)CONCAT17(uVar2,CONCAT16(
                                                  in_stack_ffffffffffffff4e,
                                                  CONCAT15(in_stack_ffffffffffffff4d,
                                                           CONCAT14(in_stack_ffffffffffffff4c,
                                                                    in_stack_ffffffffffffff48)))));
        Token::~Token((Token *)0x3faae9);
        std::any::~any((any *)0x3faaf3);
      }
      else {
        std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        local_1 = compileError(in_RDI,(string *)
                                      CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff4e,
                                                              CONCAT15(in_stack_ffffffffffffff4d,
                                                                       CONCAT14(
                                                  in_stack_ffffffffffffff4c,
                                                  in_stack_ffffffffffffff48)))));
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
      }
      std::__cxx11::string::~string(local_48);
      goto LAB_003fabea;
    }
  }
  local_1 = 0;
LAB_003fabea:
  Token::~Token((Token *)0x3fabf7);
  return (bool)(local_1 & 1);
}

Assistant:

bool SelectionCompiler::clauseChemObjName() {
    Token token = tokenNext();
    if (token.tok == Token::identifier &&
        token.value.type() == typeid(std::string)) {
      std::string name = std::any_cast<std::string>(token.value);
      if (isNameValid(name)) {
        return addTokenToPostfix(Token(Token::name, name));
      } else {
        return compileError("invalid name: " + name);
      }
    }

    return false;
  }